

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.h
# Opt level: O3

QString * __thiscall
QCborStreamReader::readAllString(QString *__return_storage_ptr__,QCborStreamReader *this)

{
  QArrayData *data;
  bool bVar1;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  bVar1 = _readAndAppendToString_helper(this,__return_storage_ptr__);
  if (!bVar1) {
    data = &((__return_storage_ptr__->d).d)->super_QArrayData;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString readAllString()
    {
        QString dst;
        if (!readAndAppendToString(dst))
            dst = QString{};
        return dst;
    }